

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O1

void crc32(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint8_t *buf;
  
  uVar3 = ~seed;
  iVar4 = len;
  if (7 < len) {
    do {
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*key ^ (byte)uVar3)];
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 1) ^ (byte)uVar3)];
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 2) ^ (byte)uVar3)];
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 3) ^ (byte)uVar3)];
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 4) ^ (byte)uVar3)];
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 5) ^ (byte)uVar3)];
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + 6) ^ (byte)uVar3)];
      pbVar1 = (byte *)((long)key + 7);
      key = (void *)((long)key + 8);
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*pbVar1 ^ (byte)uVar3)];
      iVar4 = len + -8;
      bVar2 = 0xf < len;
      len = iVar4;
    } while (bVar2);
  }
  if (iVar4 != 0) {
    lVar5 = 0;
    do {
      uVar3 = uVar3 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar5) ^ (byte)uVar3)];
      lVar5 = lVar5 + 1;
    } while (iVar4 != (int)lVar5);
  }
  *(uint *)out = ~uVar3;
  return;
}

Assistant:

void crc32 ( const void * key, int len, uint32_t seed, void * out )
{
  uint8_t * buf = (uint8_t*)key;
  uint32_t crc = seed ^ 0xffffffffL;

  while (len >= 8)
  {
    DO8(buf);
    len -= 8;
  }

  while(len--)
  {
    DO1(buf);
  } 

  crc ^= 0xffffffffL;

  *(uint32_t*)out = crc;
}